

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brg_sha1.c
# Opt level: O0

void sha1_hash(uchar *data,unsigned_long len,sha1_ctx *ctx)

{
  uint uVar1;
  __uint32_t _Var2;
  int iVar3;
  int local_34;
  uchar *puStack_30;
  int _i;
  uchar *sp;
  uint_32t space;
  uint_32t pos;
  sha1_ctx *ctx_local;
  unsigned_long len_local;
  uchar *data_local;
  
  sp._4_4_ = ctx->count[0] & 0x3f;
  sp._0_4_ = 0x40 - sp._4_4_;
  uVar1 = ctx->count[0] + (int)len;
  ctx->count[0] = uVar1;
  puStack_30 = data;
  ctx_local = (sha1_ctx *)len;
  if (uVar1 < len) {
    ctx->count[1] = ctx->count[1] + 1;
  }
  while ((sha1_ctx *)(ulong)(uint)sp <= ctx_local) {
    memcpy((void *)((long)ctx->wbuf + (ulong)sp._4_4_),puStack_30,(ulong)(uint)sp);
    puStack_30 = puStack_30 + (uint)sp;
    ctx_local = (sha1_ctx *)((long)ctx_local - (ulong)(uint)sp);
    sp._0_4_ = 0x40;
    sp._4_4_ = 0;
    local_34 = 0x10;
    while (iVar3 = local_34 + -1, local_34 != 0) {
      _Var2 = __bswap_32(ctx->wbuf[iVar3]);
      ctx->wbuf[iVar3] = _Var2;
      local_34 = iVar3;
    }
    sha1_compile(ctx);
  }
  memcpy((void *)((long)ctx->wbuf + (ulong)sp._4_4_),puStack_30,(size_t)ctx_local);
  return;
}

Assistant:

VOID_RETURN sha1_hash(const unsigned char data[], unsigned long len, sha1_ctx ctx[1])
{   uint_32t pos = (uint_32t)(ctx->count[0] & SHA1_MASK),
            space = SHA1_BLOCK_SIZE - pos;
    const unsigned char *sp = data;

    if((ctx->count[0] += len) < len)
        ++(ctx->count[1]);

    while(len >= space)     /* tranfer whole blocks if possible  */
    {
        memcpy(((unsigned char*)ctx->wbuf) + pos, sp, space);
        sp += space; len -= space; space = SHA1_BLOCK_SIZE; pos = 0;
        bsw_32(ctx->wbuf, SHA1_BLOCK_SIZE >> 2);
        sha1_compile(ctx);
    }

    memcpy(((unsigned char*)ctx->wbuf) + pos, sp, len);
}